

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uint uVar4;
  code *pcVar5;
  int ret;
  int local_124;
  uchar *local_120;
  uint local_114;
  secp256k1_ecdsa_signature *local_110;
  uchar *local_108;
  void *local_100;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  uchar nonce32 [32];
  secp256k1_scalar non;
  
  local_120 = msghash32;
  local_100 = noncedata;
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/secp256k1.c"
            ,0x239,"test condition failed: ctx != NULL");
    abort();
  }
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (msghash32 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msghash32 != NULL";
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "signature != NULL";
  }
  else {
    if (seckey != (uchar *)0x0) {
      ret = 0;
      r.d[0] = 0;
      r.d[1] = 0;
      r.d[2] = 0;
      r.d[3] = 0;
      s.d[0] = 0;
      s.d[1] = 0;
      s.d[2] = 0;
      s.d[3] = 0;
      pcVar5 = nonce_function_rfc6979;
      if (noncefp != (secp256k1_nonce_function)0x0) {
        pcVar5 = noncefp;
      }
      local_110 = signature;
      local_108 = seckey;
      local_114 = secp256k1_scalar_set_b32_seckey(&sec,seckey);
      secp256k1_scalar_cmov(&sec,&secp256k1_scalar_one,local_114 ^ 1);
      secp256k1_scalar_set_b32(&msg,local_120,(int *)0x0);
      uVar4 = 0;
      while( true ) {
        iVar1 = (*pcVar5)(nonce32,local_120,local_108,(uchar *)0x0,local_100,uVar4);
        ret = (int)(iVar1 != 0);
        if (iVar1 == 0) break;
        local_124 = secp256k1_scalar_set_b32_seckey(&non,nonce32);
        secp256k1_declassify(ctx,&local_124,4);
        if (local_124 != 0) {
          ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx,&r,&s,&sec,&msg,&non,(int *)0x0);
          secp256k1_declassify(ctx,&ret,4);
          if (ret != 0) goto LAB_0010292b;
        }
        uVar4 = uVar4 + 1;
      }
      ret = 0;
LAB_0010292b:
      ret = ret & local_114;
      secp256k1_memclear(nonce32,0x20);
      secp256k1_scalar_clear(&msg);
      secp256k1_scalar_clear(&non);
      secp256k1_scalar_clear(&sec);
      secp256k1_scalar_cmov(&r,&secp256k1_scalar_zero,(uint)(ret == 0));
      secp256k1_scalar_cmov(&s,&secp256k1_scalar_zero,(uint)(ret == 0));
      *(uint64_t *)(local_110->data + 0x10) = r.d[2];
      *(uint64_t *)(local_110->data + 0x18) = r.d[3];
      *(uint64_t *)local_110->data = r.d[0];
      *(uint64_t *)(local_110->data + 8) = r.d[1];
      *(uint64_t *)(local_110->data + 0x20) = s.d[0];
      *(uint64_t *)(local_110->data + 0x28) = s.d[1];
      *(uint64_t *)(local_110->data + 0x30) = s.d[2];
      *(uint64_t *)(local_110->data + 0x38) = s.d[3];
      return ret;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}